

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O3

vector<Card,_std::allocator<Card>_> * __thiscall
Node::get_untried_moves
          (vector<Card,_std::allocator<Card>_> *__return_storage_ptr__,Node *this,
          vector<Card,_std::allocator<Card>_> *legalMoves)

{
  pointer pCVar1;
  pointer pCVar2;
  long lVar3;
  Card *pCVar4;
  iterator iVar5;
  ulong uVar6;
  pointer ppNVar7;
  vector<Card,_std::allocator<Card>_> tried_cards;
  Card triedCard;
  Card *local_58;
  iterator iStack_50;
  Card *local_48;
  Card local_38;
  
  local_58 = (Card *)0x0;
  iStack_50._M_current = (Card *)0x0;
  local_48 = (Card *)0x0;
  ppNVar7 = (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppNVar7 !=
      (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      local_38 = *(Card *)(*ppNVar7)->m_move;
      if (iStack_50._M_current == local_48) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)&local_58,iStack_50,&local_38);
      }
      else {
        *iStack_50._M_current = local_38;
        iStack_50._M_current = iStack_50._M_current + 1;
      }
      ppNVar7 = ppNVar7 + 1;
    } while (ppNVar7 !=
             (this->m_children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pCVar1 = (legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pCVar1 != pCVar2) {
    uVar6 = (long)pCVar2 - (long)pCVar1 >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar1,pCVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar1,pCVar2);
  }
  iVar5._M_current = iStack_50._M_current;
  pCVar4 = local_58;
  if (local_58 != iStack_50._M_current) {
    uVar6 = (long)iStack_50._M_current - (long)local_58 >> 3;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,iStack_50._M_current,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pCVar4,iVar5._M_current);
  }
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  __set_difference<__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__normal_iterator<Card*,std::vector<Card,std::allocator<Card>>>,std::back_insert_iterator<std::vector<Card,std::allocator<Card>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (legalMoves->super__Vector_base<Card,_std::allocator<Card>_>)._M_impl.
             super__Vector_impl_data._M_finish,local_58,iStack_50._M_current,__return_storage_ptr__)
  ;
  if (local_58 != (Card *)0x0) {
    operator_delete(local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Card> Node::get_untried_moves(std::vector<Card> legalMoves)
{
    std::vector<Card> tried_cards;
    for (std::vector<Node*>::iterator childIterator = m_children.begin();
         childIterator != m_children.end(); ++childIterator)
    {
        player_move* tried_move = (*childIterator)->get_move();
        Card triedCard = std::get<1>(*tried_move);
        tried_cards.push_back(triedCard);
    }

    std::sort(legalMoves.begin(), legalMoves.end());
    std::sort(tried_cards.begin(), tried_cards.end());

    std::vector<Card> untried_moves;
    std::set_difference (legalMoves.begin(), legalMoves.end(), tried_cards.begin(), tried_cards.end(), back_inserter(untried_moves));

    return untried_moves;
}